

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PassthroughTestInstance *this)

{
  undefined8 *puVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  Buffer *pBVar3;
  undefined8 uVar4;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  bool bVar5;
  TestStatus *pTVar6;
  undefined1 pipelineLayout [8];
  undefined1 commandBuffer [8];
  Handle<(vk::HandleType)14> HVar7;
  pointer pWVar8;
  VkDescriptorPool VVar9;
  Allocation *pAVar10;
  bool bVar11;
  deUint32 dVar12;
  int iVar13;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  TextureFormat TVar14;
  Buffer **ppBVar15;
  ulong uVar16;
  GraphicsPipelineBuilder *pGVar17;
  const_iterator cVar18;
  TessPrimitiveType primitiveType;
  VkImageLayout oldLayout;
  int iVar19;
  Allocation *alloc;
  VkDeviceSize VVar20;
  long lVar21;
  PipelineDescription *pPVar22;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  undefined4 uVar23;
  IVec2 renderSize;
  ConstPixelBufferAccess image0;
  ConstPixelBufferAccess image1;
  TextureFormat local_488;
  pointer pWStack_480;
  pointer local_478;
  VkAllocationCallbacks *pVStack_470;
  Vec4 local_468;
  TextureFormat local_458;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_450;
  Buffer *local_438 [2];
  TestStatus *local_428;
  VkQueue local_420;
  PipelineDescription *local_418;
  Buffer *local_410;
  IVec3 positionDeviation;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_3d0;
  TextureFormat local_3b8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_3b0;
  undefined1 local_398 [8];
  Handle<(vk::HandleType)14> HStack_390;
  pointer local_388;
  VkDescriptorPool VStack_380;
  Handle<(vk::HandleType)14> local_370;
  pointer local_368;
  pointer local_358;
  ios_base local_320 [132];
  deUint32 local_29c;
  bool local_298;
  VkPrimitiveTopology local_294;
  Image local_218;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_198;
  TextureFormat local_188;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_180;
  TextureFormat local_168;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_160;
  TextureFormat local_148;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_140;
  TextureFormat local_128;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_120;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  Buffer local_f0;
  Buffer local_c0;
  Buffer local_90;
  Buffer local_60;
  
  local_428 = __return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,3);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_420 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar12 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_398,0x18,0x20);
  tessellation::Buffer::Buffer
            (&local_c0,vk,device,allocator,(VkBufferCreateInfo *)local_398,(MemoryRequirement)0x1);
  if ((this->m_params).useTessLevels == true) {
    puVar1 = (undefined8 *)
             (local_c0.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    puVar1[2] = *(undefined8 *)((this->m_params).tessLevels.outer + 2);
    uVar4 = *(undefined8 *)(this->m_params).tessLevels.outer;
    *puVar1 = *(undefined8 *)(this->m_params).tessLevels.inner;
    puVar1[1] = uVar4;
    ::vk::flushMappedMemoryRange
              (vk,device,
               (VkDeviceMemory)
               ((local_c0.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (local_c0.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,0x18);
  }
  VVar20 = (long)(this->m_params).vertices.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_params).vertices.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_398,VVar20,0x80);
  tessellation::Buffer::Buffer
            (&local_f0,vk,device,allocator,(VkBufferCreateInfo *)local_398,(MemoryRequirement)0x1);
  pAVar10 = local_f0.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memcpy((local_f0.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,
         (this->m_params).vertices.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start,VVar20);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar10->m_memory).m_internal,pAVar10->m_offset,VVar20);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_398);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)local_398,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,2
                       ,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&image0,this_00,vk,device,0);
  DStack_3b0.m_device = (VkDevice)image0._16_8_;
  DStack_3b0.m_allocator = (VkAllocationCallbacks *)image0.m_pitch.m_data._4_8_;
  local_3b8 = image0.m_format;
  DStack_3b0.m_deviceIface = (DeviceInterface *)image0.m_size.m_data._0_8_;
  image0.m_format.order = R;
  image0.m_format.type = SNORM_INT8;
  image0.m_size.m_data[0] = 0;
  image0.m_size.m_data[1] = 0;
  image0.m_size.m_data[2] = 0;
  image0.m_pitch.m_data[0] = 0;
  image0.m_pitch.m_data[1] = 0;
  image0.m_pitch.m_data[2] = 0;
  if (local_368 != (pointer)0x0) {
    operator_delete(local_368,(long)local_358 - (long)local_368);
  }
  if ((VkAllocationCallbacks *)VStack_380.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_380.m_internal,local_370.m_internal - VStack_380.m_internal);
  }
  if ((TextureFormat)local_398 != (TextureFormat)0x0) {
    operator_delete((void *)local_398,(long)local_388 - (long)local_398);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&image0);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&image0,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_398,this_01,vk,device,1,1);
  DStack_120.m_device = (VkDevice)local_388;
  DStack_120.m_allocator = (VkAllocationCallbacks *)VStack_380.m_internal;
  local_128.order = local_398._0_4_;
  local_128.type = local_398._4_4_;
  DStack_120.m_deviceIface = (DeviceInterface *)HStack_390.m_internal;
  local_398._0_4_ = R;
  local_398._4_4_ = SNORM_INT8;
  HStack_390.m_internal = 0;
  local_388 = (pointer)0x0;
  VStack_380.m_internal = 0;
  if (image0.m_format != (TextureFormat)0x0) {
    operator_delete((void *)image0.m_format,image0._16_8_ - (long)image0.m_format);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)local_398,vk,device,
                    (VkDescriptorPool)local_128,(VkDescriptorSetLayout)local_3b8);
  local_478 = local_388;
  pVStack_470 = (VkAllocationCallbacks *)VStack_380.m_internal;
  local_488.order = local_398._0_4_;
  local_488.type = local_398._4_4_;
  pWStack_480 = (pointer)HStack_390.m_internal;
  tessLevelsBufferInfo.buffer.m_internal =
       local_c0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  tessLevelsBufferInfo.offset = 0;
  tessLevelsBufferInfo.range = 0x18;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_398);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)local_398,local_488.order,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (local_368 != (pointer)0x0) {
    operator_delete(local_368,(long)local_358 - (long)local_368);
  }
  if ((VkAllocationCallbacks *)VStack_380.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_380.m_internal,local_370.m_internal - VStack_380.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)local_398);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)local_398,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&local_218,vk,device,allocator,(VkImageCreateInfo *)local_398,(MemoryRequirement)0x0)
  ;
  iVar19 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar14 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar13 = tcu::getPixelSize(TVar14);
  VVar20 = (VkDeviceSize)(iVar19 * iVar13);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_398,VVar20,2);
  tessellation::Buffer::Buffer
            (&local_60,vk,device,allocator,(VkBufferCreateInfo *)local_398,(MemoryRequirement)0x1);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_398,VVar20,2);
  tessellation::Buffer::Buffer
            (&local_90,vk,device,allocator,(VkBufferCreateInfo *)local_398,(MemoryRequirement)0x1);
  local_1a8 = 1;
  uStack_1a0 = 1;
  local_198 = 1;
  subresourceRange.levelCount._0_1_ = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange._9_7_ = 0;
  subresourceRange.layerCount = 1;
  local_438[0] = &local_60;
  local_410 = &local_90;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_398,vk,device,
                (VkImage)local_218.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  DStack_140.m_device = (VkDevice)local_388;
  DStack_140.m_allocator = (VkAllocationCallbacks *)VStack_380.m_internal;
  local_148.order = local_398._0_4_;
  local_148.type = local_398._4_4_;
  DStack_140.m_deviceIface = (DeviceInterface *)HStack_390.m_internal;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)local_398,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  DStack_450.m_device = (VkDevice)local_388;
  DStack_450.m_allocator = (VkAllocationCallbacks *)VStack_380.m_internal;
  local_458.order = local_398._0_4_;
  local_458.type = local_398._4_4_;
  DStack_450.m_deviceIface = (DeviceInterface *)HStack_390.m_internal;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)local_398,vk,device,
                  (VkRenderPass)local_398,(VkImageView)local_148,renderSize.m_data[0],
                  renderSize.m_data[1],1);
  DStack_160.m_device = (VkDevice)local_388;
  DStack_160.m_allocator = (VkAllocationCallbacks *)VStack_380.m_internal;
  local_168.order = local_398._0_4_;
  local_168.type = local_398._4_4_;
  DStack_160.m_deviceIface = (DeviceInterface *)HStack_390.m_internal;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_398,vk,device,
                     (VkDescriptorSetLayout)local_3b8);
  pipelineLayout = local_398;
  DStack_3d0.m_device = (VkDevice)local_388;
  DStack_3d0.m_allocator = (VkAllocationCallbacks *)VStack_380.m_internal;
  DStack_3d0.m_deviceIface = (DeviceInterface *)HStack_390.m_internal;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)local_398,vk,device,dVar12);
  DStack_180.m_device = (VkDevice)local_388;
  DStack_180.m_allocator = (VkAllocationCallbacks *)VStack_380.m_internal;
  local_188.order = local_398._0_4_;
  local_188.type = local_398._4_4_;
  DStack_180.m_deviceIface = (DeviceInterface *)HStack_390.m_internal;
  TVar14 = (TextureFormat)local_398;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_398,vk,device,(VkCommandPool)local_398,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar9.m_internal = VStack_380.m_internal;
  pWVar8 = local_388;
  HVar7.m_internal = HStack_390.m_internal;
  commandBuffer = local_398;
  primitiveType = TVar14.order;
  TVar14 = (TextureFormat)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_398 = (undefined1  [8])TVar14;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_390);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&HStack_390,(this->m_params).message._M_dataplus._M_p,
             (this->m_params).message._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_390);
  std::ios_base::~ios_base(local_320);
  if ((this->m_params).useTessLevels == true) {
    local_398 = (undefined1  [8])TVar14;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_390);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&HStack_390,"Tessellation levels: ",0x15);
    getTessellationLevelsString_abi_cxx11_
              ((string *)&image0,(tessellation *)&(this->m_params).tessLevels,
               (TessLevels *)(ulong)(this->m_params).primitiveType,primitiveType);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&HStack_390,(char *)image0.m_format,image0.m_size.m_data._0_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (image0.m_format != (TextureFormat)(image0.m_size.m_data + 2)) {
      operator_delete((void *)image0.m_format,image0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_390);
    std::ios_base::~ios_base(local_320);
  }
  local_418 = (this->m_params).pipelineCases;
  ppBVar15 = local_438;
  lVar21 = 0;
  bVar11 = true;
  do {
    bVar5 = bVar11;
    memset(&HStack_390,0,0xf4);
    local_29c = 1;
    uVar16 = (ulong)(this->m_params).primitiveType;
    local_294 = VK_PRIMITIVE_TOPOLOGY_LAST;
    if (uVar16 < 3) {
      local_294 = *(VkPrimitiveTopology *)(&DAT_00b4d730 + uVar16 * 4);
    }
    local_398._0_4_ = renderSize.m_data[0];
    local_398._4_4_ = renderSize.m_data[1];
    local_298 = true;
    TVar14 = ::vk::mapVkFormat(VK_FORMAT_R32G32B32A32_SFLOAT);
    dVar12 = tcu::getPixelSize(TVar14);
    pGVar17 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                        ((GraphicsPipelineBuilder *)local_398,VK_FORMAT_R32G32B32A32_SFLOAT,dVar12);
    pGVar17->m_patchControlPoints = (this->m_params).inputPatchVertices;
    p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)((this->super_TestInstance).m_context)->m_progCollection;
    image0.m_format = (TextureFormat)(image0.m_size.m_data + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&image0,"vert","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var2,(key_type *)&image0);
    pGVar17 = GraphicsPipelineBuilder::setShader
                        (pGVar17,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                         *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
    p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)((this->super_TestInstance).m_context)->m_progCollection;
    image1.m_format = (TextureFormat)(image1.m_size.m_data + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&image1,"frag","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var2,(key_type *)&image1);
    GraphicsPipelineBuilder::setShader
              (pGVar17,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,
               *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
    if (image1.m_format != (TextureFormat)(image1.m_size.m_data + 2)) {
      operator_delete((void *)image1.m_format,image1._16_8_ + 1);
    }
    if (image0.m_format != (TextureFormat)(image0.m_size.m_data + 2)) {
      operator_delete((void *)image0.m_format,image0._16_8_ + 1);
    }
    pPVar22 = local_418 + lVar21;
    if (pPVar22->useTessellation == true) {
      p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                *)((this->super_TestInstance).m_context)->m_progCollection;
      image0.m_format = (TextureFormat)(image0.m_size.m_data + 2);
      std::__cxx11::string::_M_construct<char_const*>((string *)&image0,"tesc","");
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(p_Var2,(key_type *)&image0);
      pGVar17 = GraphicsPipelineBuilder::setShader
                          ((GraphicsPipelineBuilder *)local_398,vk,device,
                           VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                           *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       *)((this->super_TestInstance).m_context)->m_progCollection,
                      &pPVar22->tessEvalShaderName);
      GraphicsPipelineBuilder::setShader
                (pGVar17,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                 *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
      if (image0.m_format != (TextureFormat)(image0.m_size.m_data + 2)) {
        operator_delete((void *)image0.m_format,image0._16_8_ + 1);
      }
    }
    if (pPVar22->useGeometry == true) {
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       *)((this->super_TestInstance).m_context)->m_progCollection,
                      &pPVar22->geomShaderName);
      GraphicsPipelineBuilder::setShader
                ((GraphicsPipelineBuilder *)local_398,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                 *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
    }
    GraphicsPipelineBuilder::build
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&image0,(GraphicsPipelineBuilder *)local_398
               ,vk,device,(VkPipelineLayout)pipelineLayout,(VkRenderPass)local_458);
    image1.m_size.m_data[2] = image0.m_size.m_data[2];
    image1.m_pitch.m_data[0] = image0.m_pitch.m_data[0];
    image1.m_pitch.m_data[1] = image0.m_pitch.m_data[1];
    image1.m_pitch.m_data[2] = image0.m_pitch.m_data[2];
    image1.m_format = image0.m_format;
    image1.m_size.m_data[0] = image0.m_size.m_data[0];
    image1.m_size.m_data[1] = image0.m_size.m_data[1];
    beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
    oldLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
    if (bVar5) {
      oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    }
    local_1c8 = 1;
    uStack_1c0 = 1;
    local_1b8 = 1;
    subresourceRange_00.levelCount._0_1_ = 1;
    subresourceRange_00.aspectMask = 1;
    subresourceRange_00.baseMipLevel = 0;
    subresourceRange_00._9_7_ = 0;
    subresourceRange_00.layerCount = 1;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)&image0,(uint)(byte)~bVar5 << 0xb,0x100,oldLayout,
               VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
               (VkImage)local_218.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal,subresourceRange_00);
    uVar23 = SUB84((VkImageMemoryBarrier *)&image0,0);
    (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x1001,0x80,0,0,0,0,0,1,uVar23);
    image0.m_format.order = R;
    image0.m_format.type = SNORM_INT8;
    image0.m_size.m_data[0] = renderSize.m_data[0];
    image0.m_size.m_data[1] = renderSize.m_data[1];
    local_468.m_data[0] = 0.0;
    local_468.m_data[1] = 0.0;
    local_468.m_data[2] = 0.0;
    local_468.m_data[3] = 1.0;
    beginRenderPass(vk,(VkCommandBuffer)commandBuffer,(VkRenderPass)local_458,
                    (VkFramebuffer)local_168,(VkRect2D *)&image0,&local_468);
    (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,image1.m_format);
    image0.m_format.order = R;
    image0.m_format.type = SNORM_INT8;
    (*vk->_vptr_DeviceInterface[0x58])
              (vk,commandBuffer,0,1,&local_f0,(VkImageMemoryBarrier *)&image0);
    if ((this->m_params).useTessLevels == true) {
      (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,0,pipelineLayout,0,1,&local_488,0,0);
    }
    (*vk->_vptr_DeviceInterface[0x59])
              (vk,commandBuffer,
               (ulong)((long)(this->m_params).vertices.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_params).vertices.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4,1,0,0);
    endRenderPass(vk,(VkCommandBuffer)commandBuffer);
    local_1e8 = 1;
    uStack_1e0 = 1;
    local_1d8 = 1;
    subresourceRange_01.levelCount._0_1_ = 1;
    subresourceRange_01.aspectMask = 1;
    subresourceRange_01.baseMipLevel = 0;
    subresourceRange_01._9_7_ = 0;
    subresourceRange_01.layerCount = 1;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)&image0,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
               VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
               (VkImage)local_218.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal,subresourceRange_01);
    (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x400,0x1000,0,0,0,0,0,1,uVar23);
    subresourceLayers.baseArrayLayer = 0;
    subresourceLayers.layerCount = 1;
    subresourceLayers.aspectMask = 1;
    subresourceLayers.mipLevel = 0;
    extent.depth = 1;
    extent.width = renderSize.m_data[0];
    extent.height = renderSize.m_data[1];
    makeBufferImageCopy((VkBufferImageCopy *)&image0,extent,subresourceLayers);
    pBVar3 = *ppBVar15;
    (*vk->_vptr_DeviceInterface[99])
              (vk,commandBuffer,
               local_218.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
               m_internal,6,
               (pBVar3->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,1,uVar23);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&image0,0x1000,0x2000,
               (VkBuffer)
               (pBVar3->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,VVar20);
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,commandBuffer,0x1000,0x4000,0,0,0,1,(VkImageMemoryBarrier *)&image0,0,0);
    endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
    submitCommandsAndWait(vk,device,local_420,(VkCommandBuffer)commandBuffer);
    if (image1.m_format != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&image1.m_size,
                 (VkPipeline)image1.m_format);
    }
    GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_398);
    pAVar10 = local_60.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    lVar21 = 1;
    ppBVar15 = &local_410;
    bVar11 = false;
  } while (bVar5);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_60.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_60.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,VVar20);
  local_398 = (undefined1  [8])::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&image0,(TextureFormat *)local_398,renderSize.m_data[0],renderSize.m_data[1],1,
             pAVar10->m_hostPtr);
  pAVar10 = local_90.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_90.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_90.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,VVar20);
  pTVar6 = local_428;
  local_398 = (undefined1  [8])::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&image1,(TextureFormat *)local_398,renderSize.m_data[0],renderSize.m_data[1],1,
             pAVar10->m_hostPtr);
  local_468.m_data[0] = 1.12104e-44;
  local_468.m_data[1] = 1.12104e-44;
  local_468.m_data[2] = 1.12104e-44;
  local_468.m_data[3] = 3.57331e-43;
  positionDeviation.m_data[0] = 1;
  positionDeviation.m_data[1] = 1;
  positionDeviation.m_data[2] = 0;
  TVar14 = (TextureFormat)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_398 = (undefined1  [8])TVar14;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_390);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&HStack_390,"In image comparison:\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&HStack_390,"  Reference - ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&HStack_390,(this->m_params).pipelineCases[0].description._M_dataplus._M_p,
             (this->m_params).pipelineCases[0].description._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&HStack_390,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&HStack_390,"  Result    - ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&HStack_390,(this->m_params).pipelineCases[1].description._M_dataplus._M_p,
             (this->m_params).pipelineCases[1].description._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&HStack_390,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_390);
  std::ios_base::~ios_base(local_320);
  bVar11 = tcu::intThresholdPositionDeviationCompare
                     ((TestLog *)TVar14,"ImageCompare","Image comparison",&image0,&image1,
                      (UVec4 *)&local_468,&positionDeviation,true,COMPARE_LOG_RESULT);
  local_398 = (undefined1  [8])&local_388;
  if (bVar11) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"OK","");
    pTVar6->m_code = QP_TEST_RESULT_PASS;
    (pTVar6->m_description)._M_dataplus._M_p = (pointer)&(pTVar6->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar6->m_description,local_398,
               (VkCommandBuffer)(HStack_390.m_internal + (long)local_398));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,"Image comparison failed","");
    pTVar6->m_code = QP_TEST_RESULT_FAIL;
    (pTVar6->m_description)._M_dataplus._M_p = (pointer)&(pTVar6->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar6->m_description,local_398,
               (VkCommandBuffer)(HStack_390.m_internal + (long)local_398));
  }
  if (local_398 != (undefined1  [8])&local_388) {
    operator_delete((void *)local_398,
                    (ulong)((long)&(local_388->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((TextureFormat)commandBuffer != (TextureFormat)0x0) {
    local_398 = commandBuffer;
    (**(code **)(*(long *)HVar7.m_internal + 0x240))(HVar7.m_internal,pWVar8,VVar9.m_internal,1);
  }
  if (local_188 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_180,(VkCommandPool)local_188);
  }
  if ((TextureFormat)pipelineLayout != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_3d0,(VkPipelineLayout)pipelineLayout);
  }
  if (local_168 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&DStack_160,(VkFramebuffer)local_168);
  }
  if (local_458 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_450,(VkRenderPass)local_458);
  }
  if (local_148 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&DStack_140,(VkImageView)local_148);
  }
  if (local_90.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_90.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_90.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_90.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_90.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_90.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_60.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_60.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_60.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_60.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_60.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_60.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_218.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_218.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_218.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_218.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_218.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_218.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  if (local_488 != (TextureFormat)0x0) {
    local_398._0_4_ = local_488.order;
    local_398._4_4_ = local_488.type;
    (*(code *)(pWStack_480->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x14].imageView.m_internal)
              (pWStack_480,local_478,pVStack_470,1);
  }
  if (local_128 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&DStack_120,(VkDescriptorPool)local_128);
  }
  if (local_3b8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&DStack_3b0,(VkDescriptorSetLayout)local_3b8);
  }
  if (local_f0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_f0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_f0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_f0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_f0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_f0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_c0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_c0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_c0.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_c0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_c0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_c0.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  return pTVar6;
}

Assistant:

tcu::TestStatus PassthroughTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER);
	DE_STATIC_ASSERT(PIPELINE_CASES == 2);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Tessellation levels
	const Buffer tessLevelsBuffer (vk, device, allocator, makeBufferCreateInfo(sizeof(TessLevels), VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	if (m_params.useTessLevels)
	{
		const Allocation& alloc = tessLevelsBuffer.getAllocation();
		TessLevels* const bufferTessLevels = static_cast<TessLevels*>(alloc.getHostPtr());
		*bufferTessLevels = m_params.tessLevels;
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
	}

	// Vertex attributes

	const VkDeviceSize	vertexDataSizeBytes = sizeInBytes(m_params.vertices);
	const VkFormat		vertexFormat		= VK_FORMAT_R32G32B32A32_SFLOAT;
	const Buffer		vertexBuffer		(vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &m_params.vertices[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
	}

	// Descriptors - make descriptor for tessellation levels, even if we don't use them, to simplify code

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet		   (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  tessLevelsBufferInfo = makeDescriptorBufferInfo(*tessLevelsBuffer, 0ull, sizeof(TessLevels));

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.update(vk, device);

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification.
	//                      We use two buffers, one for each case.

	const VkDeviceSize	colorBufferSizeBytes		= renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer1				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer		colorBuffer2				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer* const colorBuffer[PIPELINE_CASES] = { &colorBuffer1, &colorBuffer2 };

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Message explaining the test
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		log << tcu::TestLog::Message << m_params.message << tcu::TestLog::EndMessage;

		if (m_params.useTessLevels)
			log << tcu::TestLog::Message << "Tessellation levels: " << getTessellationLevelsString(m_params.tessLevels, m_params.primitiveType) << tcu::TestLog::EndMessage;
	}

	for (int pipelineNdx = 0; pipelineNdx < PIPELINE_CASES; ++pipelineNdx)
	{
		const PipelineDescription& pipelineDescription = m_params.pipelineCases[pipelineNdx];
		GraphicsPipelineBuilder	   pipelineBuilder;

		pipelineBuilder
			.setPrimitiveTopology		  (getPrimitiveTopology(m_params.primitiveType))
			.setRenderSize				  (renderSize)
			.setBlend					  (true)
			.setVertexInputSingleAttribute(vertexFormat, tcu::getPixelSize(mapVkFormat(vertexFormat)))
			.setPatchControlPoints		  (m_params.inputPatchVertices)
			.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
			.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				m_context.getBinaryCollection().get("frag"), DE_NULL);

		if (pipelineDescription.useTessellation)
			pipelineBuilder
				.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
				.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(pipelineDescription.tessEvalShaderName), DE_NULL);

		if (pipelineDescription.useGeometry)
			pipelineBuilder
				.setShader				  (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				m_context.getBinaryCollection().get(pipelineDescription.geomShaderName), DE_NULL);

		const Unique<VkPipeline> pipeline (pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

		// Draw commands

		beginCommandBuffer(vk, *cmdBuffer);

		// Change color attachment image layout
		{
			// State is slightly different on the first iteration.
			const VkImageLayout currentLayout = (pipelineNdx == 0 ? VK_IMAGE_LAYOUT_UNDEFINED : VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);
			const VkAccessFlags srcFlags	  = (pipelineNdx == 0 ? (VkAccessFlags)0          : (VkAccessFlags)VK_ACCESS_TRANSFER_READ_BIT);

			const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				srcFlags, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				currentLayout, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				*colorAttachmentImage, colorImageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT | VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
		}

		// Begin render pass
		{
			const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(renderSize.x(), renderSize.y()),
			};
			const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

			beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
		}

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		if (m_params.useTessLevels)
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(m_params.vertices.size()), 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		// Copy render result to a host-visible buffer
		{
			const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				*colorAttachmentImage, colorImageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
		}
		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, colorBuffer[pipelineNdx]->get(), 1u, &copyRegion);
		}
		{
			const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, colorBuffer[pipelineNdx]->get(), 0ull, colorBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results

	tcu::ConstPixelBufferAccess image0 = getPixelBufferAccess(vk, device, *colorBuffer[0], colorFormat, colorBufferSizeBytes, renderSize);
	tcu::ConstPixelBufferAccess image1 = getPixelBufferAccess(vk, device, *colorBuffer[1], colorFormat, colorBufferSizeBytes, renderSize);

	const tcu::UVec4 colorThreshold    (8, 8, 8, 255);
	const tcu::IVec3 positionDeviation (1, 1, 0);		// 3x3 search kernel
	const bool		 ignoreOutOfBounds = true;

	tcu::TestLog& log = m_context.getTestContext().getLog();
	log << tcu::TestLog::Message
		<< "In image comparison:\n"
		<< "  Reference - " << m_params.pipelineCases[0].description << "\n"
		<< "  Result    - " << m_params.pipelineCases[1].description << "\n"
		<< tcu::TestLog::EndMessage;

	const bool ok = tcu::intThresholdPositionDeviationCompare(
		log, "ImageCompare", "Image comparison", image0, image1, colorThreshold, positionDeviation, ignoreOutOfBounds, tcu::COMPARE_LOG_RESULT);

	return (ok ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
}